

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm_ldst.h
# Opt level: O0

uint16_t arm_lduw_code(CPUARMState_conflict *env,target_ulong addr,_Bool sctlr_b)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool do_swap;
  uint16_t uVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool sctlr_b_local;
  target_ulong addr_local;
  CPUARMState_conflict *env_local;
  
  tcg_ctx_00 = env->uc->tcg_ctx;
  do_swap = bswap_code(sctlr_b);
  uVar1 = translator_lduw_swap(tcg_ctx_00,env,addr,do_swap);
  return uVar1;
}

Assistant:

static inline uint16_t arm_lduw_code(CPUARMState *env, target_ulong addr,
                                     bool sctlr_b)
{
    TCGContext *tcg_ctx = env->uc->tcg_ctx;
    /* In big-endian (BE32) mode, adjacent Thumb instructions have been swapped
       within each word.  Undo that now.  */
    // Unicorn: Note that we don't have any loader so this patch makes no sense.
    //          And sctlr_b is 0 in aarch64.
    // if (sctlr_b) {
    //     addr ^= 2;
    // }
    return translator_lduw_swap(tcg_ctx, env, addr, bswap_code(sctlr_b));
}